

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ImportSharedObjectIntoProcess
          (CSharedMemoryObjectManager *this,CPalThread *pthr,CObjectType *pot,CObjectAttributes *poa
          ,SHMPTR shmSharedObjectData,SHMObjData *psmod,bool fAddRefSharedData,
          CSharedMemoryObject **ppshmobj)

{
  _LIST_ENTRY *p_Var1;
  SynchronizationSupport SVar2;
  PLIST_ENTRY p_Var3;
  PLIST_ENTRY _EX_ListHead;
  PLIST_ENTRY _EX_Blink;
  PLIST_ENTRY pleObjectList;
  CSharedMemoryObject *pshmobj;
  PAL_ERROR palError;
  bool fAddRefSharedData_local;
  SHMObjData *psmod_local;
  SHMPTR shmSharedObjectData_local;
  CObjectAttributes *poa_local;
  CObjectType *pot_local;
  CPalThread *pthr_local;
  CSharedMemoryObjectManager *this_local;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ImportSharedObjectIntoProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x447);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (pot == (CObjectType *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ImportSharedObjectIntoProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x448);
    fprintf(_stderr,"Expression: NULL != pot\n");
  }
  if (poa == (CObjectAttributes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ImportSharedObjectIntoProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x449);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if (shmSharedObjectData == 0) {
    fprintf(_stderr,"] %s %s:%d","ImportSharedObjectIntoProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x44a);
    fprintf(_stderr,"Expression: SHMNULL != shmSharedObjectData\n");
  }
  if (psmod == (SHMObjData *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ImportSharedObjectIntoProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,1099);
    fprintf(_stderr,"Expression: NULL != psmod\n");
  }
  if (ppshmobj == (CSharedMemoryObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","ImportSharedObjectIntoProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x44c);
    fprintf(_stderr,"Expression: NULL != ppshmobj\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  SVar2 = CObjectType::GetSynchronizationSupport(pot);
  if (SVar2 == WaitableObject) {
    pleObjectList =
         (PLIST_ENTRY)
         InternalNew<CorUnix::CSharedMemoryWaitableObject,CorUnix::CObjectType*,_CRITICAL_SECTION*,unsigned_long,CorUnix::_SHMObjData*,bool>
                   (pot,&this->m_csListLock,shmSharedObjectData,psmod,fAddRefSharedData);
  }
  else {
    pleObjectList =
         (PLIST_ENTRY)
         InternalNew<CorUnix::CSharedMemoryObject,CorUnix::CObjectType*,_CRITICAL_SECTION*,unsigned_long,CorUnix::_SHMObjData*,bool>
                   (pot,&this->m_csListLock,shmSharedObjectData,psmod,fAddRefSharedData);
  }
  if (pleObjectList == (PLIST_ENTRY)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pshmobj._0_4_ = 0xe;
  }
  else {
    pshmobj._0_4_ = (*(code *)pleObjectList->Flink[8].Flink)(pleObjectList,pthr,poa);
    if ((PAL_ERROR)pshmobj == 0) {
      if (psmod->dwNameLength == 0) {
        _EX_Blink = &this->m_leAnonymousObjects;
      }
      else {
        _EX_Blink = &this->m_leNamedObjects;
      }
      p_Var1 = _EX_Blink->Blink;
      p_Var3 = CSharedMemoryObject::GetObjectListLink((CSharedMemoryObject *)pleObjectList);
      p_Var3->Flink = _EX_Blink;
      p_Var3 = CSharedMemoryObject::GetObjectListLink((CSharedMemoryObject *)pleObjectList);
      p_Var3->Blink = p_Var1;
      p_Var3 = CSharedMemoryObject::GetObjectListLink((CSharedMemoryObject *)pleObjectList);
      p_Var1->Flink = p_Var3;
      p_Var3 = CSharedMemoryObject::GetObjectListLink((CSharedMemoryObject *)pleObjectList);
      _EX_Blink->Blink = p_Var3;
      *ppshmobj = (CSharedMemoryObject *)pleObjectList;
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return (PAL_ERROR)pshmobj;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::ImportSharedObjectIntoProcess(
    CPalThread *pthr,
    CObjectType *pot,
    CObjectAttributes *poa,
    SHMPTR shmSharedObjectData,
    SHMObjData *psmod,
    bool fAddRefSharedData,
    CSharedMemoryObject **ppshmobj
    )
{
    PAL_ERROR palError = NO_ERROR;
    CSharedMemoryObject *pshmobj;
    PLIST_ENTRY pleObjectList;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != pot);
    _ASSERTE(NULL != poa);
    _ASSERTE(SHMNULL != shmSharedObjectData);
    _ASSERTE(NULL != psmod);
    _ASSERTE(NULL != ppshmobj);

    ENTRY("CSharedMemoryObjectManager::ImportSharedObjectIntoProcess(pthr=%p, "
        "pot=%p, poa=%p, shmSharedObjectData=%p, psmod=%p, fAddRefSharedData=%d, "
        "ppshmobj=%p)\n",
        pthr,
        pot,
        poa,
        shmSharedObjectData,
        psmod,
        fAddRefSharedData,
        ppshmobj
        );
    
    if (CObjectType::WaitableObject == pot->GetSynchronizationSupport())
    {
        pshmobj = InternalNew<CSharedMemoryWaitableObject>(pot,
                                                           &m_csListLock,
                                                           shmSharedObjectData,
                                                           psmod,
                                                           fAddRefSharedData);
    }
    else
    {
        pshmobj = InternalNew<CSharedMemoryObject>(pot,
                                                   &m_csListLock,
                                                   shmSharedObjectData,
                                                   psmod,
                                                   fAddRefSharedData);
    }

    if (NULL != pshmobj)
    {
        palError = pshmobj->InitializeFromExistingSharedData(pthr, poa);
        if (NO_ERROR == palError)
        {
            if (0 != psmod->dwNameLength)
            {
                pleObjectList = &m_leNamedObjects;
            }
            else
            {
                pleObjectList = &m_leAnonymousObjects;
            }
            
            InsertTailList(pleObjectList, pshmobj->GetObjectListLink());
        }
        else
        {
            goto ImportSharedObjectIntoProcessExit;
        }
    }
    else
    {
        ERROR("Unable to allocate new object\n");
        palError = ERROR_OUTOFMEMORY;
        goto ImportSharedObjectIntoProcessExit;
    }

    *ppshmobj = pshmobj;

ImportSharedObjectIntoProcessExit:

    LOGEXIT("CSharedMemoryObjectManager::ImportSharedObjectIntoProcess returns %d\n", palError);

    return palError;
}